

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  undefined8 *puVar1;
  stbi__uint32 b;
  stbi__context *s;
  uint uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  stbi_uc *psVar8;
  byte *pbVar9;
  void *pvVar10;
  byte bVar11;
  ulong uVar12;
  byte *pbVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  stbi_uc **ppsVar14;
  int iVar15;
  uint uVar16;
  int *piVar17;
  int iVar18;
  long lVar19;
  int b_00;
  ulong uVar20;
  long in_FS_OFFSET;
  
  s = z->s;
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0xb) {
LAB_0011a8fc:
    pcVar7 = "bad SOF len";
  }
  else {
    psVar8 = s->img_buffer;
    if (psVar8 < s->img_buffer_end) {
LAB_0011a931:
      s->img_buffer = psVar8 + 1;
      if (*psVar8 == '\b') {
        sVar3 = stbi__get16be(s);
        s->img_y = sVar3;
        if (sVar3 == 0) {
          pcVar7 = "no header height";
          goto LAB_0011adb2;
        }
        sVar3 = stbi__get16be(s);
        s->img_x = sVar3;
        if (sVar3 == 0) {
          pcVar7 = "0 width";
          goto LAB_0011adb2;
        }
        if (0x1000000 < s->img_y) {
          pcVar7 = "too large";
          goto LAB_0011adb2;
        }
        pbVar13 = s->img_buffer;
        if (pbVar13 < s->img_buffer_end) {
LAB_0011a9c4:
          pbVar9 = pbVar13 + 1;
          s->img_buffer = pbVar9;
          bVar11 = *pbVar13;
          uVar20 = (ulong)bVar11;
          if ((bVar11 < 5) && ((0x1aU >> (bVar11 & 0x1f) & 1) != 0)) {
            s->img_n = (uint)bVar11;
            uVar12 = (ulong)(uint)bVar11;
            ppsVar14 = &z->img_comp[0].data;
            do {
              *ppsVar14 = (stbi_uc *)0x0;
              ppsVar14[3] = (stbi_uc *)0x0;
              ppsVar14 = ppsVar14 + 0xc;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
            if (uVar2 == (uint)bVar11 + (uint)bVar11 * 2 + 8) {
              z->rgb = 0;
              piVar17 = &z->img_comp[0].tq;
              lVar19 = 0;
              do {
                iVar6 = (int)uVar20;
                if (pbVar9 < s->img_buffer_end) {
LAB_0011aa57:
                  s->img_buffer = pbVar9 + 1;
                  bVar11 = *pbVar9;
                  pbVar9 = pbVar9 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar9 = s->img_buffer;
                    iVar6 = s->img_n;
                    goto LAB_0011aa57;
                  }
                  bVar11 = 0;
                }
                ((anon_struct_96_18_0d0905d3 *)(piVar17 + -3))->id = (uint)bVar11;
                if ((iVar6 == 3) && (bVar11 == "RGB"[lVar19])) {
                  z->rgb = z->rgb + 1;
                }
                if (s->img_buffer_end <= pbVar9) {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar9 = s->img_buffer;
                    goto LAB_0011aaac;
                  }
                  piVar17[-2] = 0;
LAB_0011adab:
                  pcVar7 = "bad H";
                  goto LAB_0011adb2;
                }
LAB_0011aaac:
                pbVar13 = pbVar9 + 1;
                s->img_buffer = pbVar13;
                bVar11 = *pbVar9;
                piVar17[-2] = (uint)(bVar11 >> 4);
                if ((byte)(bVar11 + 0xb0) < 0xc0) goto LAB_0011adab;
                piVar17[-1] = bVar11 & 0xf;
                if ((bVar11 & 0xf) - 5 < 0xfffffffc) {
                  pcVar7 = "bad V";
                  goto LAB_0011adb2;
                }
                if (pbVar13 < s->img_buffer_end) {
LAB_0011aaff:
                  s->img_buffer = pbVar13 + 1;
                  bVar11 = *pbVar13;
                  *piVar17 = (uint)bVar11;
                  pbVar9 = pbVar13 + 1;
                  if (3 < bVar11) {
                    pcVar7 = "bad TQ";
                    goto LAB_0011adb2;
                  }
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar13 = s->img_buffer;
                    goto LAB_0011aaff;
                  }
                  *piVar17 = 0;
                  pbVar9 = pbVar13;
                }
                lVar19 = lVar19 + 1;
                iVar6 = s->img_n;
                uVar20 = (ulong)iVar6;
                piVar17 = piVar17 + 0x18;
              } while (lVar19 < (long)uVar20);
              if (scan != 0) {
                return 1;
              }
              sVar3 = s->img_x;
              b = s->img_y;
              iVar4 = stbi__mad3sizes_valid(sVar3,b,iVar6,0);
              if (iVar4 == 0) {
                *(char **)(in_FS_OFFSET + -0x20) = "too large";
                return 0;
              }
              uVar2 = 1;
              uVar12 = 1;
              if (0 < iVar6) {
                uVar12 = 1;
                lVar19 = 0;
                uVar2 = 1;
                do {
                  uVar5 = *(uint *)((long)&z->img_comp[0].h + lVar19);
                  uVar16 = *(uint *)((long)&z->img_comp[0].v + lVar19);
                  if ((int)uVar2 < (int)uVar5) {
                    uVar2 = uVar5;
                  }
                  if ((int)uVar12 < (int)uVar16) {
                    uVar12 = (ulong)uVar16;
                  }
                  lVar19 = lVar19 + 0x60;
                } while (uVar20 * 0x60 != lVar19);
              }
              iVar4 = (int)uVar12;
              uVar16 = ((sVar3 + uVar2 * 8) - 1) / (uVar2 * 8);
              uVar5 = ((b + iVar4 * 8) - 1) / (uint)(iVar4 * 8);
              z->img_h_max = uVar2;
              z->img_v_max = iVar4;
              z->img_mcu_w = uVar2 * 8;
              z->img_mcu_h = iVar4 * 8;
              z->img_mcu_x = uVar16;
              z->img_mcu_y = uVar5;
              if (iVar6 < 1) {
                return 1;
              }
              iVar6 = 1;
              lVar19 = 0;
              while( true ) {
                iVar15 = *(int *)((long)&z->img_comp[0].h + lVar19);
                iVar18 = *(int *)((long)&z->img_comp[0].v + lVar19);
                *(uint *)((long)&z->img_comp[0].x + lVar19) = (iVar15 * sVar3 + (uVar2 - 1)) / uVar2
                ;
                *(int *)((long)&z->img_comp[0].y + lVar19) =
                     (int)((iVar18 * b + iVar4 + -1) / uVar12);
                iVar15 = iVar15 * uVar16;
                a = iVar15 * 8;
                *(int *)((long)&z->img_comp[0].w2 + lVar19) = a;
                iVar18 = iVar18 * uVar5;
                b_00 = iVar18 * 8;
                *(int *)((long)&z->img_comp[0].h2 + lVar19) = b_00;
                pvVar10 = stbi__malloc_mad2(a,b_00,0xf);
                puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar19);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined8 *)((long)&z->img_comp[0].coeff + lVar19) = 0;
                *(void **)((long)&z->img_comp[0].raw_data + lVar19) = pvVar10;
                why = extraout_EDX;
                if (pvVar10 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].data + lVar19) =
                     (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
                if (z->progressive != 0) {
                  *(int *)((long)&z->img_comp[0].coeff_w + lVar19) = iVar15;
                  *(int *)((long)&z->img_comp[0].coeff_h + lVar19) = iVar18;
                  pvVar10 = stbi__malloc_mad3(a,b_00,2,0xf);
                  *(void **)((long)&z->img_comp[0].raw_coeff + lVar19) = pvVar10;
                  why = extraout_EDX_00;
                  if (pvVar10 == (void *)0x0) break;
                  *(ulong *)((long)&z->img_comp[0].coeff + lVar19) =
                       (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
                }
                iVar6 = iVar6 + 1;
                lVar19 = lVar19 + 0x60;
                if (uVar20 * 0x60 == lVar19) {
                  return 1;
                }
              }
              *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
              stbi__free_jpeg_components(z,iVar6,why);
              return 0;
            }
            goto LAB_0011a8fc;
          }
        }
        else if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar13 = s->img_buffer;
          goto LAB_0011a9c4;
        }
        pcVar7 = "bad component count";
        goto LAB_0011adb2;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar8 = s->img_buffer;
      goto LAB_0011a931;
    }
    pcVar7 = "only 8-bit";
  }
LAB_0011adb2:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar7;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}